

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simUtils.c
# Opt level: O3

int Sim_UtilCountOnes(uint *pSimInfo,int nSimWords)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (0 < nSimWords) {
    uVar2 = 1;
    if (1 < nSimWords * 4) {
      uVar2 = (ulong)(uint)(nSimWords * 4);
    }
    uVar3 = 0;
    iVar1 = 0;
    do {
      iVar1 = iVar1 + bit_count[*(byte *)((long)pSimInfo + uVar3)];
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
    return iVar1;
  }
  return 0;
}

Assistant:

int Sim_UtilCountOnes( unsigned * pSimInfo, int nSimWords )
{
    unsigned char * pBytes;
    int nOnes, nBytes, i;
    pBytes = (unsigned char *)pSimInfo;
    nBytes = 4 * nSimWords;
    nOnes  = 0;
    for ( i = 0; i < nBytes; i++ )
        nOnes += bit_count[ pBytes[i] ];
    return nOnes;    
}